

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int TPZMatrix<std::complex<double>_>::Error(char *msg,char *msg2)

{
  size_t sVar1;
  ostream *poVar2;
  bad_exception myex;
  ostringstream out;
  undefined1 auStack_1b8 [8];
  long *local_1b0;
  long local_1a8;
  long local_1a0 [2];
  long local_190 [47];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"TPZMatrix::",0xb);
  if (msg == (char *)0x0) {
    std::ios::clear((int)auStack_1b8 + (int)*(undefined8 *)(local_190[0] + -0x18) + 0x28);
  }
  else {
    sVar1 = strlen(msg);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,msg,sVar1);
  }
  if (msg2 != (char *)0x0) {
    sVar1 = strlen(msg2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,msg2,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n",2);
  std::__cxx11::stringbuf::str();
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_1b0,local_1a8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,local_1a0[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  poVar2 = std::operator<<((ostream *)&std::cout,(char *)local_1b0);
  std::endl<char,std::char_traits<char>>(poVar2);
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,local_1a0[0] + 1);
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.cpp",
             0x48e);
}

Assistant:

int TPZMatrix<TVar>::Error(const char *msg ,const char *msg2) {
  ostringstream out;
  out << "TPZMatrix::" << msg;
  if(msg2) out << msg2;
  out << ".\n";
  std::cout<<out.str()<<std::endl;
  LOGPZ_ERROR (logger, out.str().c_str());
  DebugStop();
	std::bad_exception myex;
	throw myex;
}